

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>::operator-=
          (uintwide_t<64U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  iterator puVar1;
  iterator last;
  const_iterator u;
  const_iterator v;
  bool has_borrow;
  uintwide_t<24U,_unsigned_char,_void,_false> *other_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  if (this == (uintwide_t<64U,_unsigned_int,_void,_false> *)other) {
    puVar1 = detail::array_detail::array<unsigned_int,_2UL>::begin((array<unsigned_int,_2UL> *)this)
    ;
    last = detail::array_detail::array<unsigned_int,_2UL>::end((array<unsigned_int,_2UL> *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(puVar1,last,0);
  }
  else {
    puVar1 = detail::array_detail::array<unsigned_int,_2UL>::begin((array<unsigned_int,_2UL> *)this)
    ;
    u = detail::array_detail::array<unsigned_int,_2UL>::cbegin((array<unsigned_int,_2UL> *)this);
    v = detail::array_detail::array<unsigned_int,_2UL>::cbegin((array<unsigned_int,_2UL> *)other);
    uintwide_t<64u,unsigned_int,void,false>::
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(puVar1,u,v,2,false);
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator-=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary subtraction function.
        const auto has_borrow = eval_subtract_n(values.begin(),
                                                values.cbegin(),
                                                other.values.cbegin(),
                                                number_of_limbs,
                                                false);

        static_cast<void>(has_borrow);
      }

      return *this;
    }